

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

LoadConstantNDLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_loadconstantnd(NeuralNetworkLayer *this)

{
  bool bVar1;
  LoadConstantNDLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_loadconstantnd(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_loadconstantnd(this);
    this_00 = (LoadConstantNDLayerParams *)operator_new(0x38);
    LoadConstantNDLayerParams::LoadConstantNDLayerParams(this_00);
    (this->layer_).loadconstantnd_ = this_00;
  }
  return (LoadConstantNDLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::LoadConstantNDLayerParams* NeuralNetworkLayer::mutable_loadconstantnd() {
  if (!has_loadconstantnd()) {
    clear_layer();
    set_has_loadconstantnd();
    layer_.loadconstantnd_ = new ::CoreML::Specification::LoadConstantNDLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.loadConstantND)
  return layer_.loadconstantnd_;
}